

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall Fl_PostScript_Graphics_Driver::reset(Fl_PostScript_Graphics_Driver *this)

{
  Clip *local_18;
  Clip *c;
  Fl_PostScript_Graphics_Driver *this_local;
  
  this->gap_ = 1;
  this->clip_ = (Clip *)0x0;
  this->cb_ = '\0';
  this->cg_ = '\0';
  this->cr_ = '\0';
  Fl_Graphics_Driver::font(&this->super_Fl_Graphics_Driver,0,0xc);
  this->linewidth_ = 0;
  this->linestyle_ = 0;
  strcpy(this->linedash_,"");
  local_18 = this->clip_;
  while (local_18 != (Clip *)0x0) {
    this->clip_ = this->clip_->prev;
    if (local_18 != (Clip *)0x0) {
      operator_delete(local_18,0x18);
    }
    local_18 = this->clip_;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::reset(){
  gap_=1;
  clip_=0;
  cr_=cg_=cb_=0;
  Fl_Graphics_Driver::font(FL_HELVETICA, 12);
  linewidth_=0;
  linestyle_=FL_SOLID;
  strcpy(linedash_,"");
  Clip *c=clip_;   ////just not to have memory leaks for badly writen code (forgotten clip popping)
  
  while(c){
    clip_=clip_->prev;
    delete c;
    c=clip_;
  }
  
}